

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O1

string * generate_no_db_page_abi_cxx11_(query_table_type *query_params)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type __n;
  char *__s;
  string local_48;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (this->_M_dataplus)._M_p = (pointer)&this->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pluginInstance.header._M_dataplus._M_p,
             pluginInstance.header._M_dataplus._M_p + pluginInstance.header._M_string_length);
  if (RenX::ladder_databases[1] == *RenX::ladder_databases) {
    __s = "Error: No ladder databases loaded";
    __n = 0x21;
  }
  else {
    generate_search_abi_cxx11_(&local_48,(LadderDatabase *)0x0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (this,local_48._M_dataplus._M_p,local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    generate_database_selector_abi_cxx11_(&local_48,(LadderDatabase *)0x0,query_params);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (this,local_48._M_dataplus._M_p,local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    __s = "Error: No such database exists";
    __n = 0x1e;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this,__s,__n);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (this,pluginInstance.footer._M_dataplus._M_p,pluginInstance.footer._M_string_length);
  return this;
}

Assistant:

std::string* generate_no_db_page(const query_table_type& query_params) {
	std::string* result = new std::string(pluginInstance.header);
	if (RenX::ladder_databases.size() != 0) {
		result->append(generate_search(nullptr));
		result->append(generate_database_selector(nullptr, query_params));
		result->append("Error: No such database exists"sv);
	}
	else {
		result->append("Error: No ladder databases loaded"sv);
	}
	result->append(pluginInstance.footer);
	return result;
}